

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O0

void dg::pta::LLVMPointerGraphBuilder::addReturnNodeOperand(PSNode *callNode,PSNode *ret)

{
  bool bVar1;
  PSNodeCallRet *n;
  PSNode *in_RSI;
  PSNode *in_RDI;
  PSNodeCallRet *callReturn;
  PSNodeCallRet *in_stack_00000018;
  
  PSNode::getPairedNode(in_RDI);
  n = PSNodeCallRet::cast((PSNode *)0x1b2010);
  bVar1 = SubgraphNode<dg::pta::PSNode>::hasOperand
                    ((SubgraphNode<dg::pta::PSNode> *)in_RSI,&n->super_PSNode);
  if (!bVar1) {
    SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
              ((SubgraphNode<dg::pta::PSNode> *)in_RSI,&n->super_PSNode);
  }
  PSNodeRet::get(in_RSI);
  PSNodeRet::addReturnSite((PSNodeRet *)in_stack_00000018,callNode);
  PSNodeCallRet::addReturn(in_stack_00000018,callNode);
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addReturnNodeOperand(PSNode *callNode,
                                                   PSNode *ret) {
    assert(PSNodeRet::get(ret));
    auto *callReturn = PSNodeCallRet::cast(callNode->getPairedNode());
    // the function must be defined, since we have the return node,
    // so there must be associated the return node
    assert(callReturn);
    assert(callReturn != callNode);
    assert(callReturn->getType() == PSNodeType::CALL_RETURN);

    if (!callReturn->hasOperand(ret))
        callReturn->addOperand(ret);

    // setup return edges (do it here, since recursive calls
    // may not have build return nodes earlier)
    PSNodeRet::get(ret)->addReturnSite(callReturn);
    callReturn->addReturn(ret);
}